

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplace<QRestAccessManagerPrivate::CallerInfo_const&>
          (QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *this,QNetworkReply **key,
          CallerInfo *args)

{
  long lVar1;
  bool bVar2;
  QNetworkReply **in_RSI;
  QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *in_RDI;
  long in_FS_OFFSET;
  QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> copy;
  CallerInfo *in_stack_ffffffffffffff88;
  CallerInfo *in_stack_ffffffffffffff90;
  CallerInfo *in_stack_ffffffffffffff98;
  QNetworkReply **in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::isDetached
                    ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)
                     in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
            shouldGrow(in_RDI->d);
    if (bVar2) {
      QRestAccessManagerPrivate::CallerInfo::CallerInfo
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::
                        emplace_helper<QRestAccessManagerPrivate::CallerInfo>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QRestAccessManagerPrivate::CallerInfo::~CallerInfo(in_stack_ffffffffffffff90);
    }
    else {
      local_38 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::QHash
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)
               in_stack_ffffffffffffff90,
               (QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)
               in_stack_ffffffffffffff88);
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::detach
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)
               in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::~QHash
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)
               in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }